

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::forceCloseWithDelay(TcpConnection *this,double seconds)

{
  EventLoop *this_00;
  double delay;
  shared_ptr<sznet::net::TcpConnection> local_78;
  WeakCallback<sznet::net::TcpConnection> local_68;
  TimerCallback local_38;
  double local_18;
  double seconds_local;
  TcpConnection *this_local;
  
  if ((this->m_state == kConnected) || (this->m_state == kDisconnecting)) {
    local_18 = seconds;
    seconds_local = (double)this;
    setState(this,kDisconnecting);
    delay = local_18;
    this_00 = this->m_loop;
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this
              ((enable_shared_from_this<sznet::net::TcpConnection> *)&local_78);
    makeWeakCallback<sznet::net::TcpConnection>
              (&local_68,(sznet *)&local_78,(shared_ptr<sznet::net::TcpConnection> *)forceClose,0);
    std::function<void()>::function<sznet::WeakCallback<sznet::net::TcpConnection>,void>
              ((function<void()> *)&local_38,&local_68);
    EventLoop::runAfter(this_00,delay,&local_38);
    std::function<void_()>::~function(&local_38);
    WeakCallback<sznet::net::TcpConnection>::~WeakCallback(&local_68);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr(&local_78);
  }
  return;
}

Assistant:

void TcpConnection::forceCloseWithDelay(double seconds)
{
	if (m_state == kConnected || m_state == kDisconnecting)
	{
		setState(kDisconnecting);
		// not forceCloseInLoop to avoid race condition
		m_loop->runAfter(
			seconds,
			makeWeakCallback(shared_from_this(),
				&TcpConnection::forceClose));
	}
}